

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_dist.cpp
# Opt level: O1

Read<long> __thiscall
Omega_h::Dist::exch_reduce<long>(Dist *this,Read<long> *data,Int width,Omega_h_Op op)

{
  int *piVar1;
  void **ppvVar2;
  Alloc *pAVar3;
  undefined4 in_register_00000014;
  void *pvVar4;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  Omega_h_Op in_R8D;
  Read<signed_char> RVar5;
  Read<long> RVar6;
  Read<long> item_data;
  LOs local_70;
  Read<signed_char> local_60;
  Alloc *local_50;
  ulong local_48;
  element_type *local_40;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  local_50 = *(Alloc **)CONCAT44(in_register_00000014,width);
  if (((ulong)local_50 & 7) == 0 && local_50 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_50 = (Alloc *)(local_50->size * 8 + 1);
    }
    else {
      local_50->use_count = local_50->use_count + 1;
    }
  }
  local_48 = ((ulong *)CONCAT44(in_register_00000014,width))[1];
  exch<long>((Dist *)&stack0xffffffffffffffc0,data,(Int)&local_50);
  pAVar3 = local_50;
  if (((ulong)local_50 & 7) == 0 && local_50 != (Alloc *)0x0) {
    piVar1 = &local_50->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_50);
      operator_delete(pAVar3,0x48);
    }
  }
  local_70.write_.shared_alloc_.alloc = data[2].write_.shared_alloc_.alloc;
  if (((ulong)local_70.write_.shared_alloc_.alloc & 7) == 0 &&
      local_70.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_70.write_.shared_alloc_.alloc =
           (Alloc *)((local_70.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_70.write_.shared_alloc_.alloc)->use_count =
           (local_70.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_70.write_.shared_alloc_.direct_ptr = data[2].write_.shared_alloc_.direct_ptr;
  local_60.write_.shared_alloc_.alloc = (Alloc *)local_40;
  if (((ulong)local_40 & 7) == 0 && local_40 != (element_type *)0x0) {
    if (entering_parallel == '\x01') {
      local_60.write_.shared_alloc_.alloc = (Alloc *)((long)local_40->library_ * 8 + 1);
    }
    else {
      ppvVar2 = &(local_40->host_srcs_).read_.write_.shared_alloc_.direct_ptr;
      *(int *)ppvVar2 = *(int *)ppvVar2 + 1;
    }
  }
  local_60.write_.shared_alloc_.direct_ptr = local_38._M_pi;
  RVar5 = fan_reduce<long>((Omega_h *)this,&local_70,&local_60,op,in_R8D);
  pAVar3 = local_60.write_.shared_alloc_.alloc;
  pvVar4 = RVar5.write_.shared_alloc_.direct_ptr;
  if (((ulong)local_60.write_.shared_alloc_.alloc & 7) == 0 &&
      (element_type *)local_60.write_.shared_alloc_.alloc != (element_type *)0x0) {
    ppvVar2 = &(((HostRead<int> *)&(local_60.write_.shared_alloc_.alloc)->ptr)->read_).write_.
               shared_alloc_.direct_ptr;
    *(int *)ppvVar2 = *(int *)ppvVar2 + -1;
    if (*(int *)ppvVar2 == 0) {
      Alloc::~Alloc(local_60.write_.shared_alloc_.alloc);
      operator_delete(pAVar3,0x48);
      pvVar4 = extraout_RDX;
    }
  }
  pAVar3 = local_70.write_.shared_alloc_.alloc;
  if (((ulong)local_70.write_.shared_alloc_.alloc & 7) == 0 &&
      local_70.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_70.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_70.write_.shared_alloc_.alloc);
      operator_delete(pAVar3,0x48);
      pvVar4 = extraout_RDX_00;
    }
  }
  if (((ulong)local_40 & 7) == 0 && local_40 != (element_type *)0x0) {
    ppvVar2 = &(local_40->host_srcs_).read_.write_.shared_alloc_.direct_ptr;
    *(int *)ppvVar2 = *(int *)ppvVar2 + -1;
    if (*(int *)ppvVar2 == 0) {
      Alloc::~Alloc((Alloc *)local_40);
      operator_delete(local_40,0x48);
      pvVar4 = extraout_RDX_01;
    }
  }
  RVar6.write_.shared_alloc_.direct_ptr = pvVar4;
  RVar6.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Read<long>)RVar6.write_.shared_alloc_;
}

Assistant:

Read<T> Dist::exch_reduce(Read<T> data, Int width, Omega_h_Op op) const {
  Read<T> item_data = exch(data, width);
  return fan_reduce(roots2items_[R], item_data, width, op);
}